

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::test_string_output(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string result;
  char input [8];
  reader reader;
  undefined1 local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  long local_170;
  const_pointer local_168;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"\"alpha\"",8);
  local_190._M_dataplus._M_p = (pointer)strlen(local_160);
  local_190._M_string_length = (size_type)local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_190);
  local_170._0_4_ = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc9,"void basic_suite::test_string_output()",&local_190,&local_170);
  local_190._M_dataplus._M_p._0_4_ = trial::protocol::json::basic_reader<char>::symbol(&local_158);
  local_170._0_4_ = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xca,"void basic_suite::test_string_output()",&local_190,&local_170);
  local_190._M_dataplus._M_p._0_4_ = trial::protocol::json::basic_reader<char>::category(&local_158)
  ;
  local_170 = CONCAT44(local_170._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xcb,"void basic_suite::test_string_output()",&local_190,&local_170);
  paVar1 = &local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_190._M_dataplus._M_p = (pointer)paVar1;
  if ((local_158.decoder.current.code & error_invalid_key) == string) {
    trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
              (&local_158.decoder,&local_190);
  }
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xce,"void basic_suite::test_string_output()",&local_190,"alpha");
  local_170 = (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_168 = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.literal()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xcf,"void basic_suite::test_string_output()",&local_170,"\"alpha\"");
  bVar2 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170 = CONCAT71(local_170._1_7_,bVar2);
  local_191 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xd0,"void basic_suite::test_string_output()",&local_170,&local_191);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,
                    CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                             local_190.field_2._M_local_buf[0]) + 1);
  }
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_string_output()
{
    const char input[] = "\"alpha\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    std::string result;
    reader.value(result);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"alpha\"");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}